

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O3

void borg_clean_3(void)

{
  long lVar1;
  
  mem_free(borg_artego_what);
  borg_artego_what = (int16_t *)0x0;
  if (borg_artego_text != (char **)0x0) {
    if (L'\0' < borg_artego_size) {
      lVar1 = 0;
      do {
        string_free(borg_artego_text[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < borg_artego_size);
    }
    mem_free(borg_artego_text);
    borg_artego_text = (char **)0x0;
  }
  borg_artego_size = L'\0';
  mem_free(borg_sv_art_text);
  borg_sv_art_text = (char **)0x0;
  mem_free(borg_single_what);
  borg_single_what = (int16_t *)0x0;
  if (borg_single_text != (char **)0x0) {
    if (L'\0' < borg_single_size) {
      lVar1 = 0;
      do {
        string_free(borg_single_text[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < borg_single_size);
    }
    mem_free(borg_single_text);
    borg_single_text = (char **)0x0;
  }
  borg_single_size = L'\0';
  mem_free(borg_plural_what);
  borg_plural_what = (int16_t *)0x0;
  if (borg_plural_text != (char **)0x0) {
    if (L'\0' < borg_plural_size) {
      lVar1 = 0;
      do {
        string_free(borg_plural_text[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < borg_plural_size);
    }
    mem_free(borg_plural_text);
    borg_plural_text = (char **)0x0;
  }
  borg_plural_size = L'\0';
  mem_free(borg_sv_plural_text);
  borg_sv_plural_text = (char **)0x0;
  mem_free(safe_shops);
  safe_shops = (borg_shop *)0x0;
  mem_free(safe_home);
  safe_home = (borg_item *)0x0;
  mem_free(safe_items);
  safe_items = (borg_item *)0x0;
  mem_free(borg_shops);
  borg_shops = (borg_shop *)0x0;
  mem_free(borg_items);
  borg_items = (borg_item *)0x0;
  return;
}

Assistant:

void borg_clean_3(void)
{
    int i;

    mem_free(borg_artego_what);
    borg_artego_what = NULL;
    if (borg_artego_text) {
        for (i = 0; i < borg_artego_size; ++i) {
            string_free(borg_artego_text[i]);
        }
        mem_free(borg_artego_text);
        borg_artego_text = NULL;
    }
    borg_artego_size = 0;
    mem_free(borg_sv_art_text);
    borg_sv_art_text = NULL;
    mem_free(borg_single_what);
    borg_single_what = NULL;
    if (borg_single_text) {
        for (i = 0; i < borg_single_size; ++i) {
            string_free(borg_single_text[i]);
        }
        mem_free(borg_single_text);
        borg_single_text = NULL;
    }
    borg_single_size = 0;
    mem_free(borg_plural_what);
    borg_plural_what = NULL;
    if (borg_plural_text) {
        for (i = 0; i < borg_plural_size; ++i) {
            string_free(borg_plural_text[i]);
        }
        mem_free(borg_plural_text);
        borg_plural_text = NULL;
    }
    borg_plural_size = 0;
    mem_free(borg_sv_plural_text);
    borg_sv_plural_text = NULL;
    mem_free(safe_shops);
    safe_shops = NULL;
    mem_free(safe_home);
    safe_home = NULL;
    mem_free(safe_items);
    safe_items = NULL;
    mem_free(borg_shops);
    borg_shops = NULL;
    mem_free(borg_items);
    borg_items = NULL;
}